

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetMinStep(void *cvode_mem,realtype hmin)

{
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetMinStep","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      if (in_XMM0_Qa * in_RDI->cv_hmax_inv <= 1.0) {
        in_RDI->cv_hmin = in_XMM0_Qa;
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetMinStep",
                       "Inconsistent step size limits: hmin > hmax.");
        local_4 = -0x16;
      }
    }
    else {
      in_RDI->cv_hmin = 0.0;
      local_4 = 0;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetMinStep","hmin < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetMinStep(void *cvode_mem, realtype hmin)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMinStep", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (hmin < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMinStep", MSGCV_NEG_HMIN);
    return(CV_ILL_INPUT);
  }

  /* Passing 0 sets hmin = zero */
  if (hmin == ZERO) {
    cv_mem->cv_hmin = HMIN_DEFAULT;
    return(CV_SUCCESS);
  }

  if (hmin * cv_mem->cv_hmax_inv > ONE) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMinStep", MSGCV_BAD_HMIN_HMAX);
    return(CV_ILL_INPUT);
  }

  cv_mem->cv_hmin = hmin;

  return(CV_SUCCESS);
}